

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void webrtc::OverdriveAndSuppress(AecCore *aec,float *hNl,float hNlFb,float (*efw) [65])

{
  float fVar1;
  int local_2c;
  int i;
  float (*efw_local) [65];
  float hNlFb_local;
  float *hNl_local;
  AecCore *aec_local;
  
  for (local_2c = 0; local_2c < 0x41; local_2c = local_2c + 1) {
    if (hNlFb < hNl[local_2c]) {
      hNl[local_2c] =
           *(float *)(WebRtcAec_weightCurve + (long)local_2c * 4) * hNlFb +
           (1.0 - *(float *)(WebRtcAec_weightCurve + (long)local_2c * 4)) * hNl[local_2c];
    }
    fVar1 = powf(hNl[local_2c],
                 aec->overDriveSm * *(float *)(WebRtcAec_overDriveCurve + (long)local_2c * 4));
    hNl[local_2c] = fVar1;
    (*efw)[local_2c] = hNl[local_2c] * (*efw)[local_2c];
    efw[1][local_2c] = hNl[local_2c] * efw[1][local_2c];
    efw[1][local_2c] = efw[1][local_2c] * -1.0;
  }
  return;
}

Assistant:

static void OverdriveAndSuppress(AecCore* aec,
                                 float hNl[PART_LEN1],
                                 const float hNlFb,
                                 float efw[2][PART_LEN1]) {
  int i;
  for (i = 0; i < PART_LEN1; i++) {
    // Weight subbands
    if (hNl[i] > hNlFb) {
      hNl[i] = WebRtcAec_weightCurve[i] * hNlFb +
               (1 - WebRtcAec_weightCurve[i]) * hNl[i];
    }
    hNl[i] = powf(hNl[i], aec->overDriveSm * WebRtcAec_overDriveCurve[i]);

    // Suppress error signal
    efw[0][i] *= hNl[i];
    efw[1][i] *= hNl[i];

    // Ooura fft returns incorrect sign on imaginary component. It matters here
    // because we are making an additive change with comfort noise.
    efw[1][i] *= -1;
  }
}